

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O2

unique_ptr<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>_> __thiscall
lunasvg::SVGElement::create(SVGElement *this,Document *document,ElementID id)

{
  __uniq_ptr_impl<lunasvg::SVGPolyElement,_std::default_delete<lunasvg::SVGPolyElement>_> _Var1;
  undefined7 in_register_00000011;
  Document *document_local;
  __uniq_ptr_impl<lunasvg::SVGPolyElement,_std::default_delete<lunasvg::SVGPolyElement>_> local_20;
  ElementID id_local;
  
  document_local = document;
  id_local = id;
  switch((int)CONCAT71(in_register_00000011,id)) {
  case 2:
    std::make_unique<lunasvg::SVGCircleElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGCircleElement,_std::default_delete<lunasvg::SVGCircleElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGCircleElement,_std::default_delete<lunasvg::SVGCircleElement>_>
                 *)&local_20);
    break;
  case 3:
    std::make_unique<lunasvg::SVGClipPathElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGClipPathElement,_std::default_delete<lunasvg::SVGClipPathElement>_>
    ::~unique_ptr((unique_ptr<lunasvg::SVGClipPathElement,_std::default_delete<lunasvg::SVGClipPathElement>_>
                   *)&local_20);
    break;
  case 4:
    std::make_unique<lunasvg::SVGDefsElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGDefsElement,_std::default_delete<lunasvg::SVGDefsElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGDefsElement,_std::default_delete<lunasvg::SVGDefsElement>_>
                 *)&local_20);
    break;
  case 5:
    std::make_unique<lunasvg::SVGEllipseElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGEllipseElement,_std::default_delete<lunasvg::SVGEllipseElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGEllipseElement,_std::default_delete<lunasvg::SVGEllipseElement>_>
                 *)&local_20);
    break;
  case 6:
    std::make_unique<lunasvg::SVGGElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_>::~unique_ptr
              ((unique_ptr<lunasvg::SVGGElement,_std::default_delete<lunasvg::SVGGElement>_> *)
               &local_20);
    break;
  case 7:
    std::make_unique<lunasvg::SVGImageElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGImageElement,_std::default_delete<lunasvg::SVGImageElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGImageElement,_std::default_delete<lunasvg::SVGImageElement>_>
                 *)&local_20);
    break;
  case 8:
    std::make_unique<lunasvg::SVGLineElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGLineElement,_std::default_delete<lunasvg::SVGLineElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGLineElement,_std::default_delete<lunasvg::SVGLineElement>_>
                 *)&local_20);
    break;
  case 9:
    std::make_unique<lunasvg::SVGLinearGradientElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::
    unique_ptr<lunasvg::SVGLinearGradientElement,_std::default_delete<lunasvg::SVGLinearGradientElement>_>
    ::~unique_ptr((unique_ptr<lunasvg::SVGLinearGradientElement,_std::default_delete<lunasvg::SVGLinearGradientElement>_>
                   *)&local_20);
    break;
  case 10:
    std::make_unique<lunasvg::SVGMarkerElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGMarkerElement,_std::default_delete<lunasvg::SVGMarkerElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGMarkerElement,_std::default_delete<lunasvg::SVGMarkerElement>_>
                 *)&local_20);
    break;
  case 0xb:
    std::make_unique<lunasvg::SVGMaskElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGMaskElement,_std::default_delete<lunasvg::SVGMaskElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGMaskElement,_std::default_delete<lunasvg::SVGMaskElement>_>
                 *)&local_20);
    break;
  case 0xc:
    std::make_unique<lunasvg::SVGPathElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGPathElement,_std::default_delete<lunasvg::SVGPathElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGPathElement,_std::default_delete<lunasvg::SVGPathElement>_>
                 *)&local_20);
    break;
  case 0xd:
    std::make_unique<lunasvg::SVGPatternElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGPatternElement,_std::default_delete<lunasvg::SVGPatternElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGPatternElement,_std::default_delete<lunasvg::SVGPatternElement>_>
                 *)&local_20);
    break;
  case 0xe:
  case 0xf:
    std::make_unique<lunasvg::SVGPolyElement,lunasvg::Document*&,lunasvg::ElementID&>
              ((Document **)&local_20,(ElementID *)&document_local);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGPolyElement,_std::default_delete<lunasvg::SVGPolyElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGPolyElement,_std::default_delete<lunasvg::SVGPolyElement>_>
                 *)&local_20);
    break;
  case 0x10:
    std::make_unique<lunasvg::SVGRadialGradientElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::
    unique_ptr<lunasvg::SVGRadialGradientElement,_std::default_delete<lunasvg::SVGRadialGradientElement>_>
    ::~unique_ptr((unique_ptr<lunasvg::SVGRadialGradientElement,_std::default_delete<lunasvg::SVGRadialGradientElement>_>
                   *)&local_20);
    break;
  case 0x11:
    std::make_unique<lunasvg::SVGRectElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGRectElement,_std::default_delete<lunasvg::SVGRectElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGRectElement,_std::default_delete<lunasvg::SVGRectElement>_>
                 *)&local_20);
    break;
  case 0x12:
    std::make_unique<lunasvg::SVGStopElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGStopElement,_std::default_delete<lunasvg::SVGStopElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGStopElement,_std::default_delete<lunasvg::SVGStopElement>_>
                 *)&local_20);
    break;
  case 0x13:
    std::make_unique<lunasvg::SVGStyleElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGStyleElement,_std::default_delete<lunasvg::SVGStyleElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGStyleElement,_std::default_delete<lunasvg::SVGStyleElement>_>
                 *)&local_20);
    break;
  case 0x14:
    std::make_unique<lunasvg::SVGSVGElement,lunasvg::Document*&>((Document **)&local_20);
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    break;
  case 0x15:
    std::make_unique<lunasvg::SVGSymbolElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGSymbolElement,_std::default_delete<lunasvg::SVGSymbolElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGSymbolElement,_std::default_delete<lunasvg::SVGSymbolElement>_>
                 *)&local_20);
    break;
  case 0x16:
    std::make_unique<lunasvg::SVGTextElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGTextElement,_std::default_delete<lunasvg::SVGTextElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGTextElement,_std::default_delete<lunasvg::SVGTextElement>_>
                 *)&local_20);
    break;
  case 0x17:
    std::make_unique<lunasvg::SVGTSpanElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGTSpanElement,_std::default_delete<lunasvg::SVGTSpanElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGTSpanElement,_std::default_delete<lunasvg::SVGTSpanElement>_>
                 *)&local_20);
    break;
  case 0x18:
    std::make_unique<lunasvg::SVGUseElement,lunasvg::Document*&>((Document **)&local_20);
    _Var1._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
    .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl =
         (tuple<lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>)
         (_Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         )0x0;
    (this->super_SVGNode)._vptr_SVGNode =
         (_func_int **)
         _Var1._M_t.
         super__Tuple_impl<0UL,_lunasvg::SVGPolyElement_*,_std::default_delete<lunasvg::SVGPolyElement>_>
         .super__Head_base<0UL,_lunasvg::SVGPolyElement_*,_false>._M_head_impl;
    std::unique_ptr<lunasvg::SVGUseElement,_std::default_delete<lunasvg::SVGUseElement>_>::
    ~unique_ptr((unique_ptr<lunasvg::SVGUseElement,_std::default_delete<lunasvg::SVGUseElement>_> *)
                &local_20);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/source/svgelement.cpp"
                  ,0x76,
                  "static std::unique_ptr<SVGElement> lunasvg::SVGElement::create(Document *, ElementID)"
                 );
  }
  return (__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
         )(__uniq_ptr_data<lunasvg::SVGElement,_std::default_delete<lunasvg::SVGElement>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<SVGElement> SVGElement::create(Document* document, ElementID id)
{
    switch(id) {
    case ElementID::Svg:
        return std::make_unique<SVGSVGElement>(document);
    case ElementID::Path:
        return std::make_unique<SVGPathElement>(document);
    case ElementID::G:
        return std::make_unique<SVGGElement>(document);
    case ElementID::Rect:
        return std::make_unique<SVGRectElement>(document);
    case ElementID::Circle:
        return std::make_unique<SVGCircleElement>(document);
    case ElementID::Ellipse:
        return std::make_unique<SVGEllipseElement>(document);
    case ElementID::Line:
        return std::make_unique<SVGLineElement>(document);
    case ElementID::Defs:
        return std::make_unique<SVGDefsElement>(document);
    case ElementID::Polygon:
    case ElementID::Polyline:
        return std::make_unique<SVGPolyElement>(document, id);
    case ElementID::Stop:
        return std::make_unique<SVGStopElement>(document);
    case ElementID::LinearGradient:
        return std::make_unique<SVGLinearGradientElement>(document);
    case ElementID::RadialGradient:
        return std::make_unique<SVGRadialGradientElement>(document);
    case ElementID::Symbol:
        return std::make_unique<SVGSymbolElement>(document);
    case ElementID::Use:
        return std::make_unique<SVGUseElement>(document);
    case ElementID::Pattern:
        return std::make_unique<SVGPatternElement>(document);
    case ElementID::Mask:
        return std::make_unique<SVGMaskElement>(document);
    case ElementID::ClipPath:
        return std::make_unique<SVGClipPathElement>(document);
    case ElementID::Marker:
        return std::make_unique<SVGMarkerElement>(document);
    case ElementID::Image:
        return std::make_unique<SVGImageElement>(document);
    case ElementID::Style:
        return std::make_unique<SVGStyleElement>(document);
    case ElementID::Text:
        return std::make_unique<SVGTextElement>(document);
    case ElementID::Tspan:
        return std::make_unique<SVGTSpanElement>(document);
    default:
        assert(false);
    }

    return nullptr;
}